

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImpl::WindowImpl(WindowImpl *this)

{
  undefined3 uVar1;
  JoystickManager *pJVar2;
  JoystickState *pJVar3;
  long lVar4;
  float (*pafVar5) [8];
  JoystickState *pJVar6;
  uint i;
  long lVar7;
  byte bVar8;
  
  bVar8 = 0;
  this->_vptr_WindowImpl = (_func_int **)&PTR__WindowImpl_001649f8;
  std::queue<sf::Event,std::deque<sf::Event,std::allocator<sf::Event>>>::
  queue<std::deque<sf::Event,std::allocator<sf::Event>>,void>(&this->m_events);
  lVar7 = 0x58;
  do {
    JoystickState::JoystickState
              ((JoystickState *)((long)this->m_joystickStates[0].axes + lVar7 + -0x5c));
    lVar7 = lVar7 + 0x44;
  } while (lVar7 != 0x278);
  this->m_sensorValue[4].x = 0.0;
  this->m_sensorValue[4].y = 0.0;
  *(undefined8 *)&this->m_sensorValue[4].z = 0;
  *(undefined8 *)&this->m_sensorValue[2].z = 0;
  this->m_sensorValue[3].y = 0.0;
  this->m_sensorValue[3].z = 0.0;
  this->m_sensorValue[1].y = 0.0;
  this->m_sensorValue[1].z = 0.0;
  this->m_sensorValue[2].x = 0.0;
  this->m_sensorValue[2].y = 0.0;
  this->m_sensorValue[0].x = 0.0;
  this->m_sensorValue[0].y = 0.0;
  *(undefined8 *)&this->m_sensorValue[0].z = 0;
  this->m_sensorValue[5].y = 0.0;
  this->m_sensorValue[5].z = 0.0;
  this->m_joystickThreshold = 0.1;
  pJVar2 = JoystickManager::getInstance();
  JoystickManager::update(pJVar2);
  pafVar5 = this->m_previousAxes;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    pJVar2 = JoystickManager::getInstance();
    pJVar3 = JoystickManager::getState(pJVar2,(uint)lVar7);
    pJVar6 = this->m_joystickStates + lVar7;
    for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *(undefined3 *)&pJVar3->field_0x1;
      pJVar6->connected = pJVar3->connected;
      *(undefined3 *)&pJVar6->field_0x1 = uVar1;
      pJVar3 = (JoystickState *)((long)pJVar3 + (ulong)bVar8 * -8 + 4);
      pJVar6 = (JoystickState *)((long)pJVar6 + ((ulong)bVar8 * -2 + 1) * 4);
    }
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
      *(undefined4 *)((long)*pafVar5 + lVar4) = 0;
    }
    pafVar5 = pafVar5 + 1;
  }
  for (lVar7 = 0; lVar7 != 0x48; lVar7 = lVar7 + 0xc) {
    *(undefined8 *)((long)&this->m_sensorValue[0].x + lVar7) = 0;
    *(undefined4 *)((long)&this->m_sensorValue[0].z + lVar7) = 0;
  }
  return;
}

Assistant:

WindowImpl::WindowImpl() :
m_joystickThreshold(0.1f)
{
    // Get the initial joystick states
    JoystickManager::getInstance().update();
    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        m_joystickStates[i] = JoystickManager::getInstance().getState(i);
        std::fill_n(m_previousAxes[i], static_cast<std::size_t>(Joystick::AxisCount), 0.f);
    }

    // Get the initial sensor states
    for (unsigned int i = 0; i < Sensor::Count; ++i)
        m_sensorValue[i] = Vector3f(0, 0, 0);
}